

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line.cpp
# Opt level: O1

void __thiscall
program_options::command_line_parser::command_line_parser
          (command_line_parser *this,int argc,char **argv)

{
  char *pcVar1;
  pointer pbVar2;
  char *pcVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  char **ppcVar7;
  
  (this->m_rawArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_options_description = (options_description *)0x0;
  (this->m_rawArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_rawArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->m_positional_options_description = (positional_options_description *)0x0;
  (this->m_executableName)._M_dataplus._M_p = (pointer)&(this->m_executableName).field_2;
  (this->m_executableName)._M_string_length = 0;
  (this->m_executableName).field_2._M_local_buf[0] = '\0';
  if (0 < argc) {
    pcVar1 = *argv;
    strlen(pcVar1);
    std::__cxx11::string::_M_replace((ulong)&this->m_executableName,0,(char *)0x0,(ulong)pcVar1);
  }
  uVar5 = argc - 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->m_rawArguments,(long)(int)uVar5);
  uVar4 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar4;
  }
  ppcVar7 = argv + 1;
  for (; uVar6 * 0x20 != uVar4; uVar4 = uVar4 + 0x20) {
    pcVar1 = *ppcVar7;
    pbVar2 = (this->m_rawArguments).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar3 = *(char **)((long)&pbVar2->_M_string_length + uVar4);
    strlen(pcVar1);
    ppcVar7 = ppcVar7 + 1;
    std::__cxx11::string::_M_replace
              ((long)&(pbVar2->_M_dataplus)._M_p + uVar4,0,pcVar3,(ulong)pcVar1);
  }
  this->m_style = default_style;
  this->m_allow_unregistered = false;
  return;
}

Assistant:

command_line_parser::command_line_parser(int argc, const char* const argv[]) {
    if (argc > 0) {
        m_executableName = argv[0];
    }

    m_rawArguments.resize(argc-1);
    for (int i = 0; i < argc-1; i++) {
        m_rawArguments[i] = argv[i+1];
    }

    m_style = command_line_style::default_style;
    m_allow_unregistered = false;
}